

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O3

void __thiscall inja::Renderer::visit(Renderer *this,IfStatementNode *node)

{
  bool bVar1;
  long lVar2;
  shared_ptr<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  result;
  undefined1 local_28 [16];
  
  eval_expression_list_abi_cxx11_((Renderer *)local_28,(ExpressionListNode *)this);
  bVar1 = truthy((json *)local_28._0_8_);
  lVar2 = 0x30;
  if ((bVar1) || (lVar2 = 0x58, node->has_false_statement == true)) {
    (*(this->super_NodeVisitor)._vptr_NodeVisitor[2])
              (this,(long)&(node->super_StatementNode).super_AstNode._vptr_AstNode + lVar2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
  }
  return;
}

Assistant:

void visit(const IfStatementNode& node) {
    const auto result = eval_expression_list(node.condition);
    if (truthy(result.get())) {
      node.true_statement.accept(*this);
    } else if (node.has_false_statement) {
      node.false_statement.accept(*this);
    }
  }